

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall
CVmObjLookupTable::CVmObjLookupTable(CVmObjLookupTable *this,size_t bucket_cnt,size_t val_cnt)

{
  vm_lookup_ext *this_00;
  
  (this->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_003429b0;
  this_00 = vm_lookup_ext::alloc_ext(this,(uint)bucket_cnt,(uint)val_cnt);
  (this->super_CVmObjCollection).super_CVmObject.ext_ = (char *)this_00;
  vm_lookup_ext::init_ext(this_00);
  return;
}

Assistant:

CVmObjLookupTable::CVmObjLookupTable(VMG_ size_t bucket_cnt, size_t val_cnt)
{
    vm_val_t empty;

    /* set up an empty value */
    empty.set_empty();
    
    /* allocate our extension structure from the variable heap */
    ext_ = (char *)vm_lookup_ext::alloc_ext(vmg_ this, bucket_cnt, val_cnt);

    /* initialize the extension */
    get_ext()->init_ext();
}